

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_get_html_translation_table(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char *zKey;
  jx9_value *pVal;
  jx9_value *pValue;
  ulong uVar1;
  
  pVal = jx9_context_new_scalar(pCtx);
  if ((pVal != (jx9_value *)0x0) &&
     (pValue = jx9_context_new_array(pCtx), pValue != (jx9_value *)0x0)) {
    for (uVar1 = 0; uVar1 < 0x28; uVar1 = uVar1 + 2) {
      zKey = azHtmlEscape[uVar1 + 1];
      jx9_value_string(pVal,azHtmlEscape[uVar1],-1);
      jx9_array_add_strkey_elem(pValue,zKey,pVal);
      SyBlobReset(&pVal->sBlob);
    }
    jx9_result_value(pCtx,pValue);
    return 0;
  }
  jx9_result_null(pCtx);
  return 0;
}

Assistant:

static int jx9Builtin_get_html_translation_table(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pArray, *pValue;
	sxu32 n;
	/* Element value */
	pValue = jx9_context_new_scalar(pCtx);
	if( pValue == 0 ){
		SXUNUSED(nArg); /* cc warning */
		SXUNUSED(apArg);
		/* Return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Create a new array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		/* Return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Make the table */
	for( n = 0 ; n < SX_ARRAYSIZE(azHtmlEscape) ; n += 2 ){
		/* Prepare the value */
		jx9_value_string(pValue, azHtmlEscape[n], -1 /* Compute length automatically */);
		/* Insert the value */
		jx9_array_add_strkey_elem(pArray, azHtmlEscape[n+1], pValue);
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
	}
	/* 
	 * Return the array.
	 * Don't worry about freeing memory, everything will be automatically
	 * released upon we return from this function.
	 */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}